

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O3

void aspa_array_free(aspa_array *array,_Bool free_provider_arrays)

{
  long lVar1;
  void *ptr;
  uint uVar2;
  aspa_record *ptr_00;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (array == (aspa_array *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    ptr_00 = array->data;
    if (ptr_00 != (aspa_record *)0x0) {
      if (free_provider_arrays) {
        uVar2 = array->size;
        if (uVar2 != 0) {
          lVar3 = 0x10;
          uVar4 = 0;
          do {
            ptr = *(void **)((long)&ptr_00->customer_asn + lVar3);
            if (ptr != (void *)0x0) {
              lrtr_free(ptr);
              ptr_00 = array->data;
              *(undefined8 *)((long)&ptr_00->customer_asn + lVar3) = 0;
              uVar2 = array->size;
            }
            uVar4 = uVar4 + 1;
            lVar3 = lVar3 + 0x18;
          } while (uVar4 < uVar2);
        }
      }
      lrtr_free(ptr_00);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      lrtr_free(array);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void aspa_array_free(struct aspa_array *array, bool free_provider_arrays)
{
	if (!array)
		return;

	if (array->data) {
		if (free_provider_arrays) {
			for (size_t i = 0; i < array->size; i++) {
				if (array->data[i].provider_asns) {
					lrtr_free(array->data[i].provider_asns);
					array->data[i].provider_asns = NULL;
				}
			}
		}

		lrtr_free(array->data);
	}

	lrtr_free(array);
}